

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_csv.cpp
# Opt level: O3

void duckdb::ReadCSVTableFunction::RegisterFunction(BuiltinFunctions *set)

{
  TableFunctionSet local_3f8;
  TableFunctionSet local_3c0;
  TableFunction local_388;
  TableFunction local_1d0;
  
  GetFunction();
  MultiFileReader::CreateFunctionSet(&local_3c0,&local_1d0);
  BuiltinFunctions::AddFunction(set,&local_3c0);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::~vector
            (&local_3c0.super_FunctionSet<duckdb::TableFunction>.functions.
              super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p !=
      &local_3c0.super_FunctionSet<duckdb::TableFunction>.name.field_2) {
    operator_delete(local_3c0.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p);
  }
  local_1d0.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__TableFunction_01968a80;
  if (local_1d0.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1d0.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_1d0.super_SimpleNamedParameterFunction);
  GetAutoFunction();
  MultiFileReader::CreateFunctionSet(&local_3f8,&local_388);
  BuiltinFunctions::AddFunction(set,&local_3f8);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::~vector
            (&local_3f8.super_FunctionSet<duckdb::TableFunction>.functions.
              super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p !=
      &local_3f8.super_FunctionSet<duckdb::TableFunction>.name.field_2) {
    operator_delete(local_3f8.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p);
  }
  local_388.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__TableFunction_01968a80;
  if (local_388.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_388.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_388.super_SimpleNamedParameterFunction);
  return;
}

Assistant:

void ReadCSVTableFunction::RegisterFunction(BuiltinFunctions &set) {
	set.AddFunction(MultiFileReader::CreateFunctionSet(ReadCSVTableFunction::GetFunction()));
	set.AddFunction(MultiFileReader::CreateFunctionSet(ReadCSVTableFunction::GetAutoFunction()));
}